

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
kj::
Maybe<kj::_::Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>_>
::Maybe(Maybe<kj::_::Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>_>
        *this,Maybe<kj::_::Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>_>
              *other)

{
  bool bVar1;
  Orphan<capnp::compiler::Declaration::AnnotationApplication> *pOVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  anon_union_96_1_a8c68091_for_NullableValue<kj::_::Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>_>_2
  *paVar5;
  anon_union_96_1_a8c68091_for_NullableValue<kj::_::Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>_>_2
  *paVar6;
  uint32_t uVar7;
  
  bVar1 = (other->ptr).isSet;
  (this->ptr).isSet = bVar1;
  if (bVar1 == true) {
    paVar5 = &(other->ptr).field_1;
    uVar7 = (((TupleImpl<kj::_::Indexes<0UL,_1UL,_2UL,_3UL,_4UL>,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
               *)paVar5)->
            super_TupleElement<0U,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>
            ).value.endByte;
    paVar6 = &(this->ptr).field_1;
    (((TupleImpl<kj::_::Indexes<0UL,_1UL,_2UL,_3UL,_4UL>,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
       *)paVar6)->
    super_TupleElement<0U,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>).
    value.startByte =
         (((TupleImpl<kj::_::Indexes<0UL,_1UL,_2UL,_3UL,_4UL>,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
            *)paVar5)->
         super_TupleElement<0U,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>
         ).value.startByte;
    (((TupleImpl<kj::_::Indexes<0UL,_1UL,_2UL,_3UL,_4UL>,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
       *)paVar6)->
    super_TupleElement<0U,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>).
    value.endByte = uVar7;
    sVar3 = (other->ptr).field_1.value.impl.
            super_TupleElement<0U,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>
            .value.value.super_StringPtr.content.size_;
    (this->ptr).field_1.value.impl.
    super_TupleElement<0U,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>.
    value.value.super_StringPtr.content.ptr =
         (other->ptr).field_1.value.impl.
         super_TupleElement<0U,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>
         .value.value.super_StringPtr.content.ptr;
    (this->ptr).field_1.value.impl.
    super_TupleElement<0U,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>.
    value.value.super_StringPtr.content.size_ = sVar3;
    Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>::Maybe
              (&(this->ptr).field_1.value.impl.
                super_TupleElement<1U,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>_>.
                value,&(other->ptr).field_1.value.impl.
                       super_TupleElement<1U,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>_>
                       .value);
    *(undefined1 *)((long)&(this->ptr).field_1 + 0x40) =
         *(undefined1 *)((long)&(other->ptr).field_1 + 0x40);
    *(undefined1 *)((long)&(this->ptr).field_1 + 0x41) =
         *(undefined1 *)((long)&(other->ptr).field_1 + 0x41);
    (this->ptr).field_1.value.impl.
    super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
    .value.ptr = (other->ptr).field_1.value.impl.
                 super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
                 .value.ptr;
    (this->ptr).field_1.value.impl.
    super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
    .value.size_ = (other->ptr).field_1.value.impl.
                   super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
                   .value.size_;
    (this->ptr).field_1.value.impl.
    super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
    .value.disposer =
         (other->ptr).field_1.value.impl.
         super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
         .value.disposer;
    (other->ptr).field_1.value.impl.
    super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
    .value.ptr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
    (other->ptr).field_1.value.impl.
    super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
    .value.size_ = 0;
  }
  if ((other->ptr).isSet == true) {
    (other->ptr).isSet = false;
    pOVar2 = (other->ptr).field_1.value.impl.
             super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
             .value.ptr;
    if (pOVar2 != (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0) {
      sVar3 = (other->ptr).field_1.value.impl.
              super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
              .value.size_;
      (other->ptr).field_1.value.impl.
      super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
      .value.ptr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
      (other->ptr).field_1.value.impl.
      super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
      .value.size_ = 0;
      pAVar4 = (other->ptr).field_1.value.impl.
               super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
               .value.disposer;
      (**pAVar4->_vptr_ArrayDisposer)
                (pAVar4,pOVar2,0x20,sVar3,sVar3,
                 ArrayDisposer::
                 Dispose_<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::
                 destruct);
    }
    if ((*(char *)((long)&(other->ptr).field_1 + 0x18) == '\x01') &&
       ((other->ptr).field_1.value.impl.
        super_TupleElement<1U,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>_>.value.
        ptr.field_1.value.builder.segment != (SegmentBuilder *)0x0)) {
      capnp::_::OrphanBuilder::euthanize
                (&(other->ptr).field_1.value.impl.
                  super_TupleElement<1U,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>_>
                  .value.ptr.field_1.value.builder);
    }
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }